

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall GraphPropagator::attachToAll(GraphPropagator *this)

{
  int iVar1;
  int iVar2;
  Propagator *in_RDI;
  int j_1;
  int j;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  int pos;
  int iVar4;
  
  pos = 0;
  while( true ) {
    iVar4 = pos;
    iVar1 = nbNodes((GraphPropagator *)0x2a8ccd);
    if (iVar1 <= pos) break;
    getNodeVar((GraphPropagator *)CONCAT44(pos,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
    ;
    BoolView::attach((BoolView *)CONCAT44(iVar4,in_stack_fffffffffffffff0),in_RDI,pos,
                     in_stack_ffffffffffffffe0);
    pos = iVar4 + 1;
  }
  iVar1 = 0;
  while( true ) {
    iVar3 = iVar1;
    iVar2 = nbEdges((GraphPropagator *)0x2a8d22);
    if (iVar2 <= iVar1) break;
    getEdgeVar((GraphPropagator *)CONCAT44(pos,iVar1),in_stack_ffffffffffffffdc);
    BoolView::attach((BoolView *)CONCAT44(iVar4,iVar3),in_RDI,pos,iVar1);
    iVar1 = iVar3 + 1;
  }
  return;
}

Assistant:

void GraphPropagator::attachToAll() {
	// Do not use in inheriting classes!!
	for (int j = 0; j < nbNodes(); j++) {
		getNodeVar(j).attach(this, j, EVENT_LU);
	}
	for (int j = 0; j < nbEdges(); j++) {
		getEdgeVar(j).attach(this, j, EVENT_LU);
	}
}